

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O0

uchar * mcmalo1(mcmcx1def *ctx,ushort siz,mcmon *nump)

{
  ushort siz_00;
  size_t sVar1;
  mcmodef *pmVar2;
  mcmcx1def *ctx_00;
  mcmcx1def *in_RDX;
  ushort in_SI;
  mcmcx1def *in_RDI;
  mcmhdef *chunk_hdr;
  uchar *chunk;
  mcmodef *o;
  mcmon n;
  mcmcx1def *in_stack_00000108;
  char *in_stack_ffffffffffffffb8;
  errcxdef *in_stack_ffffffffffffffc0;
  ushort in_stack_ffffffffffffffdc;
  ushort in_stack_ffffffffffffffde;
  
  sVar1 = osrndsz((ulong)in_SI);
  siz_00 = (ushort)sVar1;
  if (0x8000 < siz_00) {
    errsigf(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,0);
  }
  while( true ) {
    pmVar2 = mcmffb(in_RDI,siz_00,(mcmon *)in_RDX);
    if (in_stack_ffffffffffffffde != 0xffff) {
      mcmsplt(in_RDX,in_stack_ffffffffffffffde,in_stack_ffffffffffffffdc);
      in_RDI->mcmcxtab[(int)(uint)in_stack_ffffffffffffffde >> 8]
      [(int)(in_stack_ffffffffffffffde & 0xff)].mcmoflg = 0xe;
      in_RDI->mcmcxtab[(int)(uint)in_stack_ffffffffffffffde >> 8]
      [(int)(in_stack_ffffffffffffffde & 0xff)].mcmolcnt = '\x01';
      *(ushort *)&in_RDX->mcmcxtab = in_stack_ffffffffffffffde;
      return pmVar2->mcmoptr;
    }
    ctx_00 = (mcmcx1def *)mcmhalo(in_stack_00000108);
    if (ctx_00 == (mcmcx1def *)0x0) break;
    pmVar2 = mcmoal(ctx_00,(mcmon *)in_stack_ffffffffffffffc0);
    if (in_stack_ffffffffffffffde == 0xffff) {
      in_RDI->mcmcxhpch = (mcmhdef *)ctx_00[-1].mcmcxcsw;
      free(&ctx_00[-1].mcmcxcsw);
      break;
    }
    *(ushort *)&ctx_00->mcmcxtab = in_stack_ffffffffffffffde;
    sVar1 = osrndsz(2);
    pmVar2->mcmoptr = (uchar *)((long)&ctx_00->mcmcxtab + sVar1);
    sVar1 = osrndsz(2);
    pmVar2->mcmosiz = 0x8000 - (short)sVar1;
    pmVar2->mcmoflg = 0x80;
    mcmlnkhd(in_RDI,&in_RDI->mcmcxfre,in_stack_ffffffffffffffde);
  }
  *(mcmon *)&in_RDX->mcmcxtab = 0xffff;
  return (uchar *)0x0;
}

Assistant:

static uchar *mcmalo1(mcmcx1def *ctx, ushort siz, mcmon *nump)
{
    mcmon    n;
    mcmodef *o;
    uchar   *chunk;
    
    MCMGLBCTX(ctx);

    /* round size to appropriate multiple */
    siz = osrndsz(siz);

    /* if it's bigger than the chunk size, we can't allocate it */
    if (siz > MCMCHUNK)
        errsig(ctx->mcmcxerr, ERR_BIGOBJ);

startover:
    /* look in the free block chain for a fit to the request */
    o = mcmffb(ctx, siz, &n);
    if (n != MCMONINV)
    {
        mcmsplt(ctx, n, siz);               /* split the block if necessary */
        mcmgobje(ctx, n)->mcmoflg = MCMOFNODISC | MCMOFLOCK | MCMOFPRES;
        mcmgobje(ctx, n)->mcmolcnt = 1;                /* one locker so far */
        *nump = n;
        return(o->mcmoptr);
    }
    
    /* nothing found; we must get space out of the heap if possible */
    chunk = mcmhalo(ctx);                            /* get space from heap */
    if (!chunk) goto error;           /* can't get any more space from heap */
    o = mcmoal(ctx, &n);               /* set up cache entry for free space */
    if (n == MCMONINV)
    {
        mcmhdef *chunk_hdr = ((mcmhdef *)chunk) - 1;
        ctx->mcmcxhpch = chunk_hdr->mcmhnxt;
        mchfre(chunk_hdr);
        goto error;         /* any error means we can't allocate the memory */
    }
    
    *(mcmon *)chunk = n;                               /* set object header */
    chunk += osrndsz(sizeof(mcmon));
    o->mcmoptr = chunk;
    o->mcmosiz = MCMCHUNK - osrndsz(sizeof(mcmon));
    o->mcmoflg = MCMOFFREE;
    mcmlnkhd(ctx, &ctx->mcmcxfre, n);
    goto startover;              /* try again, now that we have some memory */
    
error:
    *nump = MCMONINV;
    return((uchar *)0);
}